

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O3

cl_int clEnqueueCommandBufferKHR
                 (cl_uint num_queues,cl_command_queue *queues,cl_command_buffer_khr command_buffer,
                 cl_uint num_events_in_wait_list,cl_event *event_wait_list,cl_event *event)

{
  _Rb_tree_header *p_Var1;
  CTracker *pCVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  CLIntercept *this;
  byte bVar4;
  int iVar5;
  cl_int errorCode;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  mapped_type *pmVar8;
  uint64_t enqueueCounter;
  time_point tVar9;
  time_point tVar10;
  _Base_ptr p_Var11;
  cl_event *event_00;
  string queueList;
  cl_event local_event;
  string eventWaitListString;
  cl_int local_dc;
  string local_c8;
  cl_command_queue local_a8;
  cl_event *local_a0;
  string local_98;
  time_point local_78;
  cl_event *local_70;
  time_point local_68;
  undefined8 local_60;
  cl_event local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this = g_pIntercept;
  if (g_pIntercept == (CLIntercept *)0x0) {
    return -0x472;
  }
  p_Var7 = (g_pIntercept->m_CommandBufferInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header.
           _M_parent;
  if (p_Var7 == (_Base_ptr)0x0) {
LAB_0013f5e8:
    p_Var7 = (_Base_ptr)0x0;
  }
  else {
    p_Var1 = &(g_pIntercept->m_CommandBufferInfoMap)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = &p_Var1->_M_header;
    do {
      if (*(cl_command_buffer_khr *)(p_Var7 + 1) >= command_buffer) {
        p_Var6 = p_Var7;
      }
      p_Var7 = (&p_Var7->_M_left)[*(cl_command_buffer_khr *)(p_Var7 + 1) < command_buffer];
    } while (p_Var7 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var6 == p_Var1) ||
       (command_buffer < *(cl_command_buffer_khr *)(p_Var6 + 1))) goto LAB_0013f5e8;
    p_Var7 = p_Var6[1]._M_parent;
  }
  p_Var6 = (g_pIntercept->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_a0 = event;
  local_70 = event_wait_list;
  if (p_Var6 == (_Base_ptr)0x0) {
LAB_0013f627:
    local_c8._M_dataplus._M_p = (pointer)0x0;
    pmVar8 = std::
             map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
             ::at(&g_pIntercept->m_DispatchX,(key_type *)&local_c8);
  }
  else {
    p_Var1 = &(g_pIntercept->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
    p_Var11 = &p_Var1->_M_header;
    do {
      if (*(_Base_ptr *)(p_Var6 + 1) >= p_Var7) {
        p_Var11 = p_Var6;
      }
      p_Var6 = (&p_Var6->_M_left)[*(_Base_ptr *)(p_Var6 + 1) < p_Var7];
    } while (p_Var6 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var11 == p_Var1) || (p_Var7 < *(_Base_ptr *)(p_Var11 + 1)))
    goto LAB_0013f627;
    pmVar8 = (mapped_type *)&p_Var11[1]._M_parent;
  }
  if (pmVar8->clEnqueueCommandBufferKHR ==
      (_func_cl_int_cl_uint_cl_command_queue_ptr_cl_command_buffer_khr_cl_uint_cl_event_ptr_cl_event_ptr
       *)0x0) {
    return -0x472;
  }
  enqueueCounter = CLIntercept::incrementEnqueueCounter(this);
  local_a8 = CLIntercept::getCommandBufferCommandQueue(this,num_queues,queues,command_buffer);
  if (((((this->m_Config).AubCapture == true) &&
       ((this->m_Config).AubCaptureMinEnqueue <= enqueueCounter)) &&
      (enqueueCounter <= (this->m_Config).AubCaptureMaxEnqueue)) &&
     ((this->m_Config).AubCaptureIndividualEnqueues == false)) {
    CLIntercept::startAubCapture
              (this,"clEnqueueCommandBufferKHR",enqueueCounter,(cl_kernel)0x0,0,(size_t *)0x0,
               (size_t *)0x0,local_a8);
  }
  local_dc = 0;
  if ((this->m_Config).NullEnqueue != false) goto LAB_0013fb96;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  bVar4 = (this->m_Config).CallLogging;
  if ((bool)bVar4 == true) {
    CLIntercept::getObjectListString<_cl_command_queue*>(this,num_queues,queues,&local_c8);
    getFormattedEventWaitList_abi_cxx11_(&local_98,this,num_events_in_wait_list,local_70);
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    bVar4 = (this->m_Config).CallLogging;
  }
  if ((bVar4 & 1) != 0) {
    CLIntercept::callLoggingEnter
              (this,"clEnqueueCommandBufferKHR",enqueueCounter,(cl_kernel)0x0,
               "queues = %s, command_buffer = %p%s",local_c8._M_dataplus._M_p,command_buffer,
               local_50);
  }
  if ((this->m_Config).EventChecking == true) {
    CLIntercept::checkEventList
              (this,"clEnqueueCommandBufferKHR",num_events_in_wait_list,local_70,local_a0);
  }
  local_58 = (cl_event)0x0;
  if ((((this->m_Config).DevicePerformanceTiming == false) &&
      ((this->m_Config).ITTPerformanceTiming == false)) &&
     (((this->m_Config).ChromePerformanceTiming == false &&
      ((this->m_Config).DevicePerfCounterEventBasedSampling != true)))) {
    local_68.__d.__r = (duration)0;
    local_60 = 0;
  }
  else {
    local_68.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    local_60 = CONCAT71((int7)((ulong)local_68.__d.__r >> 8),local_a0 == (cl_event *)0x0);
    if (local_a0 == (cl_event *)0x0) {
      local_a0 = &local_58;
    }
  }
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_78.__d.__r = (duration)0;
  }
  else {
    local_78.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  event_00 = local_a0;
  local_dc = (*pmVar8->clEnqueueCommandBufferKHR)
                       (num_queues,queues,command_buffer,num_events_in_wait_list,local_70,local_a0);
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    tVar9.__d.__r = (duration)0;
  }
  else {
    tVar9.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
        (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
      CLIntercept::updateHostTimingStats(this,"clEnqueueCommandBufferKHR",&local_98,local_78,tVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
    }
  }
  if ((((this->m_Config).DevicePerformanceTiming == false) &&
      ((this->m_Config).ITTPerformanceTiming == false)) &&
     ((this->m_Config).ChromePerformanceTiming == false)) {
    if ((event_00 != (cl_event *)0x0) &&
       ((this->m_Config).DevicePerfCounterEventBasedSampling != false)) {
LAB_0013f949:
      if (((this->m_Config).DevicePerformanceTimingMinEnqueue <= enqueueCounter) &&
         (enqueueCounter <= (this->m_Config).DevicePerformanceTimingMaxEnqueue)) {
        paVar3 = &local_98.field_2;
        if ((this->m_Config).DevicePerformanceTimingSkipUnmap == true) {
          local_98._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_98,"clEnqueueCommandBufferKHR","");
          iVar5 = std::__cxx11::string::compare((char *)&local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar3) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          if (iVar5 == 0) goto LAB_0013fa0e;
        }
        local_98._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
        CLIntercept::addTimingEvent
                  (this,"clEnqueueCommandBufferKHR",enqueueCounter,local_68,&local_98,local_a8,
                   *event_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar3) {
          operator_delete(local_98._M_dataplus._M_p);
        }
      }
LAB_0013fa0e:
      if ((char)local_60 != '\0') {
        (*(this->m_Dispatch).clReleaseEvent)(*event_00);
        goto LAB_0013fa22;
      }
    }
  }
  else {
    if (event_00 != (cl_event *)0x0) goto LAB_0013f949;
LAB_0013fa22:
    event_00 = (cl_event *)0x0;
  }
  if ((this->m_Config).ErrorLogging == false) {
    bVar4 = (this->m_Config).ErrorAssert;
    if ((bool)bVar4 == false) {
      if ((local_dc == 0) || ((this->m_Config).NoErrors == false)) goto LAB_0013fa9a;
    }
    else if (local_dc == 0) goto LAB_0013fa5e;
LAB_0013fa78:
    if ((bVar4 & 1) != 0) {
      raise(5);
    }
    if ((this->m_Config).NoErrors != false) {
      local_dc = 0;
    }
  }
  else {
    if (local_dc != 0) {
      CLIntercept::logError(this,"clEnqueueCommandBufferKHR",local_dc);
      bVar4 = (this->m_Config).ErrorAssert;
      goto LAB_0013fa78;
    }
LAB_0013fa5e:
    local_dc = 0;
  }
LAB_0013fa9a:
  if (((event_00 != (cl_event *)0x0) && ((this->m_Config).LeakChecking != false)) &&
     (*event_00 != (cl_event)0x0)) {
    LOCK();
    pCVar2 = &(this->m_ObjectTracker).m_Events;
    (pCVar2->NumAllocations).super___atomic_base<unsigned_long>._M_i =
         (pCVar2->NumAllocations).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clEnqueueCommandBufferKHR",local_dc,event_00,(cl_sync_point_khr *)0x0);
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
    CLIntercept::chromeCallLoggingExit
              (this,"clEnqueueCommandBufferKHR",&local_98,true,enqueueCounter,local_78,tVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
  }
  if (((event_00 != (cl_event *)0x0) && (*event_00 != (cl_event)0x0)) &&
     (((this->m_Config).ChromeCallLogging != false ||
      ((this->m_Config).ChromePerformanceTiming == true)))) {
    CLIntercept::addEvent(this,*event_00,enqueueCounter);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
LAB_0013fb96:
  if ((this->m_Config).FinishAfterEnqueue == true) {
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar9.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    }
    else {
      tVar9.__d.__r = (duration)0;
    }
    CLIntercept::logFlushOrFinishAfterEnqueueStart(this,"clFinish","clEnqueueCommandBufferKHR");
    errorCode = (*(this->m_Dispatch).clFinish)(local_a8);
    CLIntercept::logFlushOrFinishAfterEnqueueEnd
              (this,"clFinish","clEnqueueCommandBufferKHR",errorCode);
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar10.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      if (((this->m_Config).HostPerformanceTiming == true) &&
         (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
          (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
        CLIntercept::updateHostTimingStats(this,"(finish after enqueue)",&local_c8,tVar9,tVar10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
      }
      if ((this->m_Config).ChromeCallLogging == true) {
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
        CLIntercept::chromeCallLoggingExit
                  (this,"(finish after enqueue)",&local_c8,false,0,tVar9,tVar10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
      }
    }
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar9.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    }
    else {
      tVar9.__d.__r = (duration)0;
    }
    CLIntercept::checkTimingEvents(this);
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar10.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      if (((this->m_Config).HostPerformanceTiming == true) &&
         (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
          (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
        CLIntercept::updateHostTimingStats(this,"(device timing overhead)",&local_c8,tVar9,tVar10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
      }
      if ((this->m_Config).ChromeCallLogging == true) {
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
        CLIntercept::chromeCallLoggingExit
                  (this,"(device timing overhead)",&local_c8,false,0,tVar9,tVar10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
      }
    }
  }
  else if ((this->m_Config).FlushAfterEnqueue == true) {
    (*(this->m_Dispatch).clFlush)(local_a8);
  }
  if (((this->m_Config).AubCapture == true) &&
     ((((this->m_Config).AubCaptureIndividualEnqueues != false ||
       (enqueueCounter < (this->m_Config).AubCaptureMinEnqueue)) ||
      ((this->m_Config).AubCaptureMaxEnqueue < enqueueCounter)))) {
    CLIntercept::stopAubCapture(this,local_a8);
  }
  return local_dc;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clEnqueueCommandBufferKHR(
    cl_uint num_queues,
    cl_command_queue* queues,
    cl_command_buffer_khr command_buffer,
    cl_uint num_events_in_wait_list,
    const cl_event* event_wait_list,
    cl_event* event)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(command_buffer);
        if( dispatchX.clEnqueueCommandBufferKHR )
        {
            cl_int  retVal = CL_SUCCESS;

            INCREMENT_ENQUEUE_COUNTER();
            COMMAND_BUFFER_GET_QUEUE( num_queues, queues, command_buffer );
            CHECK_AUBCAPTURE_START( command_queue );

            if( pIntercept->config().NullEnqueue == false )
            {
                std::string queueList;
                std::string eventWaitListString;
                if( pIntercept->config().CallLogging )
                {
                    pIntercept->getObjectListString(
                        num_queues,
                        queues,
                        queueList );
                    eventWaitListString = getFormattedEventWaitList(
                        pIntercept,
                        num_events_in_wait_list,
                        event_wait_list);
                }
                CALL_LOGGING_ENTER( "queues = %s, command_buffer = %p%s",
                    queueList.c_str(),
                    command_buffer,
                    eventWaitListString.c_str() );
                CHECK_EVENT_LIST( num_events_in_wait_list, event_wait_list, event );
                DEVICE_PERFORMANCE_TIMING_START( event );
                HOST_PERFORMANCE_TIMING_START();

                retVal = dispatchX.clEnqueueCommandBufferKHR(
                    num_queues,
                    queues,
                    command_buffer,
                    num_events_in_wait_list,
                    event_wait_list,
                    event);

                HOST_PERFORMANCE_TIMING_END();
                DEVICE_PERFORMANCE_TIMING_END( command_queue, event );
                CHECK_ERROR( retVal );
                ADD_OBJECT_ALLOCATION( event ? event[0] : NULL );
                CALL_LOGGING_EXIT_EVENT( retVal, event );
                ADD_EVENT( event ? event[0] : NULL );
            }

            FINISH_OR_FLUSH_AFTER_ENQUEUE( command_queue );
            CHECK_AUBCAPTURE_STOP( command_queue );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_BUFFER_KHR);
}